

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O2

void __thiscall
ear::GainCalculatorHOAImpl::calculate
          (GainCalculatorHOAImpl *this,HOATypeMetadata *metadata,OutputGainMat *direct,
          WarningCB *warning_cb)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  norm_f_t *norm_from;
  PointerType piVar5;
  uint uVar6;
  invalid_argument *piVar7;
  const_iterator cVar8;
  adm_error *this_00;
  long lVar9;
  long lVar10;
  norm_f_t *in_R9;
  Index in_i;
  undefined1 local_1c8 [56];
  MatrixXd D;
  VectorXi local_170;
  VectorXi local_160;
  VectorXi local_150;
  Matrix<double,__1,_3,_0,__1,_3> local_140;
  MatrixXd D_full;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_118;
  DenseStorage<double,__1,__1,_3,_0> local_e0;
  DenseStorage<double,__1,__1,__1,_0> local_d0;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  MatrixXd D_virt;
  MatrixXd Y_virt;
  CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
  local_70;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> m;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> n;
  
  piVar3 = (metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar3;
  piVar4 = (metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar9 != (long)(metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar4) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1c8,"orders and degrees must be the same size",
               (allocator<char> *)&local_118);
    invalid_argument::invalid_argument(piVar7,(string *)local_1c8);
    __cxa_throw(piVar7,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar10 = 0;
  while( true ) {
    if (lVar9 >> 2 == lVar10) {
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
                      *)ADM_norm_types_abi_cxx11_,&metadata->normalization);
      if (cVar8._M_node != (_Base_ptr)(ADM_norm_types_abi_cxx11_ + 8)) {
        if (metadata->screenRef == true) {
          local_1c8._0_4_ = 4;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_1c8 + 8),"screenRef for HOA is not implemented; ignoring",
                     (allocator<char> *)&local_118);
          std::function<void_(const_ear::Warning_&)>::operator()(warning_cb,(Warning *)local_1c8);
          std::__cxx11::string::~string((string *)(local_1c8 + 8));
        }
        if ((metadata->nfcRefDist != 0.0) || (NAN(metadata->nfcRefDist))) {
          local_1c8._0_4_ = 5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_1c8 + 8),"nfcRefDist is not implemented; ignoring",
                     (allocator<char> *)&local_118);
          std::function<void_(const_ear::Warning_&)>::operator()(warning_cb,(Warning *)local_1c8);
          std::__cxx11::string::~string((string *)(local_1c8 + 8));
        }
        norm_from = *(norm_f_t **)(cVar8._M_node + 2);
        piVar5 = (metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Eigen::
        MapBase<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
        MapBase(&n.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ,piVar5,(long)(metadata->orders).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
        piVar5 = (metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Eigen::
        MapBase<Eigen::Map<const_Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::
        MapBase(&m.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ,piVar5,(long)(metadata->degrees).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2);
        Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
                  (&local_e0,(DenseStorage<double,__1,__1,_3,_0> *)this);
        Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_140,
                   (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&n.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  );
        Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_150,
                   (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&m);
        hoa::calc_Y_virt<double(*)(int,int)>
                  (&Y_virt,(hoa *)&local_e0,&local_140,&local_150,(VectorXi *)hoa::norm_N3D,in_R9);
        free(local_150.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ;
        free(local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
             m_data);
        free(local_e0.m_data);
        D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
             (double *)
             (this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage
             .m_rows;
        local_118.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (PointerType)&Y_virt;
        Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator/
                  ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                    *)local_1c8,
                   (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_118,
                   (long *)&D);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&D_virt,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                    *)local_1c8);
        local_1c8._0_16_ =
             (undefined1  [16])
             Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->G_virt,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&D_virt);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&D,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)local_1c8);
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_b8,(DenseStorage<double,__1,__1,__1,_0> *)&Y_virt);
        hoa::normalize_decode_matrix(&D,(MatrixXd *)&local_b8);
        free(local_b8.m_data);
        Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_160,
                   (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&n);
        Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_170,
                   (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&m);
        hoa::normalisation_conversion<double(*)(int,int),double(*)(int,int)>
                  ((hoa *)local_1c8,&local_160,&local_170,hoa::norm_N3D,norm_from);
        local_118.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data
             = (PointerType)local_1c8;
        Eigen::EigenBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,-1,1,0,-1,1>const>>::
        applyThisOnTheRight<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((EigenBase<Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>> *)
                   &local_118,&D);
        free((void *)local_1c8._0_8_);
        free(local_170.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ;
        free(local_160.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data)
        ;
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                  ((ConstantReturnType *)local_1c8,
                   (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows,
                   D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                   m_cols);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&D_full,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)local_1c8);
        for (lVar9 = 0;
            lVar9 < D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols; lVar9 = lVar9 + 1) {
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c8,
                     &D_full,lVar9);
          local_70.m_xpr = &this->is_lfe;
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    (&local_118,&D,lVar9);
          mask_write<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_1c8,
                     &local_70,&local_118);
        }
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                  (&local_d0,(DenseStorage<double,__1,__1,__1,_0> *)&D_full);
        OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  (direct,(Matrix<double,__1,__1,_0,__1,__1> *)&local_d0);
        free(local_d0.m_data);
        free(D_full.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
        free(D_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        free(Y_virt.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
        return;
      }
      this_00 = (adm_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                     ,"unknown normalization type: \'",&metadata->normalization);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                     ,"\'");
      adm_error::adm_error(this_00,(string *)local_1c8);
      __cxa_throw(this_00,&adm_error::typeinfo,std::invalid_argument::~invalid_argument);
    }
    uVar1 = piVar3[lVar10];
    if ((int)uVar1 < 0) break;
    uVar2 = piVar4[lVar10];
    uVar6 = -uVar2;
    if (0 < (int)uVar2) {
      uVar6 = uVar2;
    }
    in_R9 = (norm_f_t *)(ulong)uVar6;
    lVar10 = lVar10 + 1;
    if (uVar1 < uVar6) {
      piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,"magnitude of degree must not be greater than order",
                 (allocator<char> *)&local_118);
      invalid_argument::invalid_argument(piVar7,(string *)local_1c8);
      __cxa_throw(piVar7,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"orders must not be negative",(allocator<char> *)&local_118);
  invalid_argument::invalid_argument(piVar7,(string *)local_1c8);
  __cxa_throw(piVar7,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GainCalculatorHOAImpl::calculate(const HOATypeMetadata &metadata,
                                        OutputGainMat &direct,
                                        const WarningCB &warning_cb) {
    if (metadata.orders.size() != metadata.degrees.size())
      throw invalid_argument("orders and degrees must be the same size");

    for (size_t i = 0; i < metadata.orders.size(); i++) {
      if (metadata.orders[i] < 0)
        throw invalid_argument("orders must not be negative");
      if (std::abs(metadata.degrees[i]) > metadata.orders[i])
        throw invalid_argument(
            "magnitude of degree must not be greater than order");
    }

    auto norm_it = ADM_norm_types.find(metadata.normalization);
    if (norm_it == ADM_norm_types.end())
      throw adm_error("unknown normalization type: '" + metadata.normalization +
                      "'");

    if (metadata.screenRef)
      warning_cb({Warning::Code::HOA_SCREENREF_NOT_IMPLEMENTED,
                  "screenRef for HOA is not implemented; ignoring"});

    if (metadata.nfcRefDist != 0.0)
      warning_cb({Warning::Code::HOA_NFCREFDIST_NOT_IMPLEMENTED,
                  "nfcRefDist is not implemented; ignoring"});

    hoa::norm_f_t &norm = norm_it->second;

    Eigen::Map<const Eigen::VectorXi> n(metadata.orders.data(),
                                        metadata.orders.size());
    Eigen::Map<const Eigen::VectorXi> m(metadata.degrees.data(),
                                        metadata.degrees.size());

    Eigen::MatrixXd Y_virt = hoa::calc_Y_virt(points, n, m, hoa::norm_N3D);
    Eigen::MatrixXd D_virt = Y_virt.transpose() / points.rows();

    Eigen::MatrixXd D = G_virt * D_virt;

    hoa::normalize_decode_matrix(D, Y_virt);

    D *= hoa::normalisation_conversion(n, m, hoa::norm_N3D, norm).asDiagonal();

    Eigen::MatrixXd D_full = Eigen::MatrixXd::Zero(is_lfe.size(), D.cols());
    for (Eigen::Index in_i = 0; in_i < D.cols(); in_i++) {
      mask_write(D_full.col(in_i), !is_lfe, D.col(in_i));
    }

    direct.write_mat(D_full);
  }